

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbox.cpp
# Opt level: O3

void QToolBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      local_20 = &local_2c;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
      goto switchD_004b8c20_caseD_3;
    case 1:
      piVar3 = (int *)_a[1];
LAB_004b8d9a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setCurrentIndex((QToolBox *)_o,*piVar3);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setCurrentWidget((QToolBox *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QToolBoxPrivate::_q_buttonClicked(*(QToolBoxPrivate **)(_o + 8));
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QToolBoxPrivate::_q_widgetDestroyed(*(QToolBoxPrivate **)(_o + 8),*_a[1]);
        return;
      }
      break;
    default:
      goto switchD_004b8c20_caseD_3;
    }
    goto LAB_004b8dd3;
  case ReadProperty:
    piVar3 = (int *)*_a;
    if (_id == 1) {
      *piVar3 = (int)((ulong)(*(long *)(*(long *)(_o + 8) + 0x280) -
                             *(long *)(*(long *)(_o + 8) + 0x278)) >> 3);
    }
    else if (_id == 0) {
      if (*(long *)(*(long *)(_o + 8) + 0x298) == 0) {
        iVar1 = -1;
      }
      else {
        iVar1 = indexOf((QToolBox *)_o,*(QWidget **)(*(long *)(*(long *)(_o + 8) + 0x298) + 0x10));
      }
      *piVar3 = iVar1;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      piVar3 = (int *)*_a;
      goto LAB_004b8d9a;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == currentChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 2) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        break;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
  }
switchD_004b8c20_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_004b8dd3:
  __stack_chk_fail();
}

Assistant:

void QToolBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->d_func()->_q_buttonClicked(); break;
        case 4: _t->d_func()->_q_widgetDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolBox::*)(int )>(_a, &QToolBox::currentChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}